

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void __thiscall
kj::List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>::
addFront(List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
         *this,TestElement *element)

{
  TestElement *pTVar1;
  TestElement *_oldHead109;
  Maybe<kj::(anonymous_namespace)::TestElement_&> **ppMVar2;
  
  if ((element->link).prev == (Maybe<kj::(anonymous_namespace)::TestElement_&> *)0x0) {
    pTVar1 = (this->head).ptr;
    (element->link).next.ptr = pTVar1;
    (element->link).prev = &this->head;
    ppMVar2 = &(pTVar1->link).prev;
    if (pTVar1 == (TestElement *)0x0) {
      ppMVar2 = &this->tail;
    }
    *ppMVar2 = &(element->link).next;
    (this->head).ptr = element;
    this->listSize = this->listSize + 1;
    return;
  }
  _::throwDoubleAdd();
}

Assistant:

void addFront(T& element) {
    if ((element.*link).prev != nullptr) _::throwDoubleAdd();
    (element.*link).next = head;
    (element.*link).prev = &head;
    KJ_IF_SOME(oldHead, head) {
      (oldHead.*link).prev = &(element.*link).next;
    } else {
      tail = &(element.*link).next;
    }